

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Scene::upsample_selected_mesh(Scene *this)

{
  SceneObject *pSVar1;
  Mesh *this_00;
  
  pSVar1 = (this->selected).object;
  if ((pSVar1 != (SceneObject *)0x0) && ((this->selected).element != (HalfedgeElement *)0x0)) {
    this_00 = (Mesh *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    if (this_00 != (Mesh *)0x0) {
      Mesh::upsample(this_00);
    }
    clearSelections(this);
    return;
  }
  return;
}

Assistant:

void Scene::upsample_selected_mesh() {
   if( selected.object == nullptr || selected.element == nullptr ) return;
   Mesh* m = dynamic_cast<Mesh*>( selected.object );
   if( m ) m->upsample();
   clearSelections();
}